

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldShard
               (char *total_shards_env,char *shard_index_env,bool in_subprocess_for_death_test)

{
  Message *pMVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  bool in_subprocess_for_death_test_local;
  char *shard_index_env_local;
  char *total_shards_env_local;
  Message local_a8;
  Message local_a0;
  Message msg_2;
  Message local_90;
  Message msg_1;
  Message local_80;
  Message msg;
  Int32 shard_index;
  Int32 total_shards;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_subprocess_for_death_test) {
    total_shards_env_local._7_1_ = false;
  }
  else {
    msg.ss_.ptr_._4_4_ = Int32FromEnvOrDie(total_shards_env,-1);
    msg.ss_.ptr_._0_4_ = Int32FromEnvOrDie(shard_index_env,-1);
    if ((msg.ss_.ptr_._4_4_ == -1) && ((Int32)msg.ss_.ptr_ == -1)) {
      total_shards_env_local._7_1_ = false;
    }
    else {
      if ((msg.ss_.ptr_._4_4_ == -1) && ((Int32)msg.ss_.ptr_ != -1)) {
        Message::Message(&msg_1);
        pMVar1 = Message::operator<<(&msg_1,(char (*) [41])
                                            "Invalid environment variables: you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x1eb2db);
        pMVar1 = Message::operator<<(pMVar1,(int *)&msg);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [9])" unset.\n");
        Message::Message(&local_80,pMVar1);
        Message::~Message(&msg_1);
        Message::GetString_abi_cxx11_(&local_30,&local_80);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&local_30);
        fflush(_stdout);
        exit(1);
      }
      if ((msg.ss_.ptr_._4_4_ != -1) && ((Int32)msg.ss_.ptr_ == -1)) {
        Message::Message(&msg_2);
        pMVar1 = Message::operator<<(&msg_2,(char (*) [41])
                                            "Invalid environment variables: you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])0x1eb2db);
        pMVar1 = Message::operator<<(pMVar1,(int *)((long)&msg.ss_.ptr_ + 4));
        pMVar1 = Message::operator<<(pMVar1,(char (*) [17])", but have left ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [9])" unset.\n");
        Message::Message(&local_90,pMVar1);
        Message::~Message(&msg_2);
        Message::GetString_abi_cxx11_(&local_50,&local_90);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&local_50);
        fflush(_stdout);
        exit(1);
      }
      if (((Int32)msg.ss_.ptr_ < 0) || (msg.ss_.ptr_._4_4_ <= (Int32)msg.ss_.ptr_)) {
        Message::Message(&local_a8);
        pMVar1 = Message::operator<<(&local_a8,
                                     (char (*) [48])
                                     "Invalid environment variables: we require 0 <= ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [4])" < ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [16])", but you have ");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [18])"GTEST_SHARD_INDEX");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x1e8442);
        pMVar1 = Message::operator<<(pMVar1,(int *)&msg);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x1ec4f1);
        pMVar1 = Message::operator<<(pMVar1,(char (*) [19])"GTEST_TOTAL_SHARDS");
        pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x1e8442);
        pMVar1 = Message::operator<<(pMVar1,(int *)((long)&msg.ss_.ptr_ + 4));
        pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x1eab44);
        Message::Message(&local_a0,pMVar1);
        Message::~Message(&local_a8);
        Message::GetString_abi_cxx11_((string *)&shard_index,&local_a0);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        ColoredPrintf(COLOR_RED,pcVar2);
        std::__cxx11::string::~string((string *)&shard_index);
        fflush(_stdout);
        exit(1);
      }
      total_shards_env_local._7_1_ = 1 < msg.ss_.ptr_._4_4_;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return total_shards_env_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool ShouldShard(const char* total_shards_env,
                 const char* shard_index_env,
                 bool in_subprocess_for_death_test) {
  if (in_subprocess_for_death_test) {
    return false;
  }

  const Int32 total_shards = Int32FromEnvOrDie(total_shards_env, -1);
  const Int32 shard_index = Int32FromEnvOrDie(shard_index_env, -1);

  if (total_shards == -1 && shard_index == -1) {
    return false;
  } else if (total_shards == -1 && shard_index != -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestShardIndex << " = " << shard_index
      << ", but have left " << kTestTotalShards << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (total_shards != -1 && shard_index == -1) {
    const Message msg = Message()
      << "Invalid environment variables: you have "
      << kTestTotalShards << " = " << total_shards
      << ", but have left " << kTestShardIndex << " unset.\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  } else if (shard_index < 0 || shard_index >= total_shards) {
    const Message msg = Message()
      << "Invalid environment variables: we require 0 <= "
      << kTestShardIndex << " < " << kTestTotalShards
      << ", but you have " << kTestShardIndex << "=" << shard_index
      << ", " << kTestTotalShards << "=" << total_shards << ".\n";
    ColoredPrintf(COLOR_RED, msg.GetString().c_str());
    fflush(stdout);
    exit(EXIT_FAILURE);
  }

  return total_shards > 1;
}